

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_switch.cpp
# Opt level: O2

bool P_CheckSwitchRange(AActor *user,line_t_conflict *line,int sideno,DVector3 *optpos)

{
  double *pdVar1;
  uint uVar2;
  side_t *psVar3;
  extsector_t *peVar4;
  F3DFloor **ppFVar5;
  undefined8 *puVar6;
  F3DFloor *pFVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  bool bVar11;
  sector_t_conflict *psVar12;
  FSwitchDef *pFVar13;
  long lVar14;
  Angle *this;
  uint i;
  ulong uVar15;
  bool bVar16;
  DVector2 local_148;
  double checkbot;
  double checktop;
  divline_t local_128;
  DVector3 local_108;
  FLineOpening open;
  divline_t local_58;
  
  psVar3 = line->sidedef[sideno];
  if (psVar3 != (side_t *)0x0) {
    uVar2 = line->flags & 0xffdfffff;
    if (0 < psVar3->textures[1].texture.texnum) {
      uVar2 = line->flags;
    }
    if ((uVar2 & 0x600000) != 0) {
      psVar12 = psVar3->sector;
      local_128.x = (line->v1->p).X;
      local_128.y = (line->v1->p).Y;
      local_128.dx = (line->delta).X;
      local_128.dy = (line->delta).Y;
      if (optpos == (DVector3 *)0x0) {
        AActor::PosRelative(&local_108,user,line);
      }
      else {
        local_108.X._0_4_ = *(undefined4 *)&optpos->X;
        local_108.X._4_4_ = *(undefined4 *)((long)&optpos->X + 4);
        local_108.Y._0_4_ = *(undefined4 *)&optpos->Y;
        local_108.Y._4_4_ = *(undefined4 *)((long)&optpos->Y + 4);
        local_108.Z = optpos->Z;
      }
      this = &(user->Angles).Yaw;
      local_58.x._0_4_ = local_108.X._0_4_;
      local_58.x._4_4_ = local_108.X._4_4_;
      local_58.y._0_4_ = local_108.Y._0_4_;
      local_58.y._4_4_ = local_108.Y._4_4_;
      local_58.dx = TAngle<double>::Cos(this);
      local_58.dy = TAngle<double>::Sin(this);
      dVar8 = P_InterceptVector(&local_128,&local_58);
      if ((line->sidedef[0]->Flags & 0x40) == 0) {
        local_148.X = local_128.x + local_128.dx * dVar8;
        local_148.Y = local_128.y + local_128.dy * dVar8;
      }
      else {
        local_148.X = local_128.x + local_128.dx * (dVar8 + 0.01);
        local_148.Y = local_128.y + local_128.dy * (dVar8 + 0.01);
        psVar12 = P_PointInSector(&local_148);
      }
      if (((line->sidedef[1] == (side_t *)0x0) || ((line->sidedef[0]->Flags & 0x40) != 0)) ||
         (P_LineOpening(&open,(AActor *)0x0,(line_t *)line,&local_148,(DVector2 *)&local_108,0),
         open.range <= 0.0)) {
        dVar9 = secplane_t::ZatPoint(&psVar12->ceilingplane,&local_148);
        dVar10 = secplane_t::ZatPoint(&psVar12->floorplane,&local_148);
        dVar8 = (user->__Pos).Z;
        if (user->Height + dVar8 < dVar10) {
          return false;
        }
        return dVar8 <= dVar9;
      }
      pFVar13 = FTextureManager::FindSwitch(&TexMan,(FTextureID)psVar3->textures[0].texture.texnum);
      if (pFVar13 == (FSwitchDef *)0x0) {
        pFVar13 = FTextureManager::FindSwitch
                            (&TexMan,(FTextureID)psVar3->textures[2].texture.texnum);
        if (pFVar13 == (FSwitchDef *)0x0) {
          if (((uVar2 >> 0x15 & 1) == 0) &&
             (pFVar13 = FTextureManager::FindSwitch
                                  (&TexMan,(FTextureID)psVar3->textures[1].texture.texnum),
             pFVar13 == (FSwitchDef *)0x0)) {
            dVar8 = (user->__Pos).Z;
            if (open.top < user->Height + dVar8) {
              return true;
            }
            bVar11 = open.bottom + -1.52587890625e-05 == dVar8;
            bVar16 = open.bottom + -1.52587890625e-05 < dVar8;
          }
          else {
            bVar11 = P_GetMidTexturePosition(line,sideno,&checktop,&checkbot);
            if (!bVar11) {
              return false;
            }
            dVar8 = (user->__Pos).Z;
            if (checktop + -1.52587890625e-05 <= dVar8) {
              return false;
            }
            dVar8 = dVar8 + user->Height;
            bVar11 = dVar8 == checkbot;
            bVar16 = dVar8 < checkbot;
          }
        }
        else {
          psVar12 = line->sidedef[1 - sideno]->sector;
          for (uVar15 = 0; peVar4 = psVar12->e,
              uVar15 < (peVar4->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
              uVar15 = uVar15 + 1) {
            pFVar7 = (peVar4->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array[uVar15];
            if ((~pFVar7->flags & 0x40001) == 0) {
              dVar9 = secplane_t::ZatPoint((pFVar7->top).plane,&local_148);
              dVar8 = (user->__Pos).Z;
              if ((dVar8 <= dVar9 + 1.52587890625e-05) &&
                 (dVar9 = user->Height,
                 dVar10 = secplane_t::ZatPoint((pFVar7->bottom).plane,&local_148),
                 dVar10 <= dVar8 + dVar9)) {
                return true;
              }
            }
          }
          pdVar1 = &(user->__Pos).Z;
          bVar11 = open.bottom == *pdVar1;
          bVar16 = open.bottom < *pdVar1;
        }
      }
      else {
        peVar4 = line->sidedef[1 - sideno]->sector->e;
        ppFVar5 = (peVar4->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array;
        uVar2 = (peVar4->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
        for (lVar14 = 0; (ulong)uVar2 << 3 != lVar14; lVar14 = lVar14 + 8) {
          puVar6 = *(undefined8 **)((long)ppFVar5 + lVar14);
          if ((~*(uint *)(puVar6 + 0xb) & 0x20001) == 0) {
            dVar9 = secplane_t::ZatPoint((secplane_t *)puVar6[5],&local_148);
            dVar8 = (user->__Pos).Z;
            if ((dVar8 <= dVar9 + 1.52587890625e-05) &&
               (dVar9 = user->Height,
               dVar10 = secplane_t::ZatPoint((secplane_t *)*puVar6,&local_148),
               dVar10 <= dVar8 + dVar9)) {
              return true;
            }
          }
        }
        dVar8 = (user->__Pos).Z + user->Height;
        bVar11 = dVar8 == open.top;
        bVar16 = dVar8 < open.top;
      }
      return !bVar16 && !bVar11;
    }
  }
  return true;
}

Assistant:

bool P_CheckSwitchRange(AActor *user, line_t *line, int sideno, const DVector3 *optpos)
{
	// Activated from an empty side -> always succeed
	side_t *side = line->sidedef[sideno];
	if (side == NULL)
		return true;

	double checktop;
	double checkbot;
	sector_t *front = side->sector;
	FLineOpening open;
	int flags = line->flags;

	if (!side->GetTexture(side_t::mid).isValid())
	{ // Do not force range checks for 3DMIDTEX lines if there is no actual midtexture.
		flags &= ~ML_3DMIDTEX;
	}

	// 3DMIDTEX forces CHECKSWITCHRANGE because otherwise it might cause problems.
	if (!(flags & (ML_3DMIDTEX|ML_CHECKSWITCHRANGE)))
		return true;

	// calculate the point where the user would touch the wall.
	divline_t dll, dlu;
	double inter;
	DVector2 check;

	P_MakeDivline (line, &dll);

	DVector3 pos = optpos? *optpos : user->PosRelative(line);
	dlu.x = pos.X;
	dlu.y = pos.Y;
	dlu.dx = user->Angles.Yaw.Cos();
	dlu.dy = user->Angles.Yaw.Sin();
	inter = P_InterceptVector(&dll, &dlu);


	// Polyobjects must test the containing sector, not the one they originate from.
	if (line->sidedef[0]->Flags & WALLF_POLYOBJ)
	{
		// Get a check point slightly inside the polyobject so that this still works
		// if the polyobject lies directly on a sector boundary
		check.X = dll.x + dll.dx * (inter + 0.01);
		check.Y = dll.y + dll.dy * (inter + 0.01);
		front = P_PointInSector(check);
	}
	else
	{
		check.X = dll.x + dll.dx * inter;
		check.Y = dll.y + dll.dy * inter;
	}


	// one sided line or polyobject
	if (line->sidedef[1] == NULL || (line->sidedef[0]->Flags & WALLF_POLYOBJ))
	{
	onesided:
		double sectorc = front->ceilingplane.ZatPoint(check);
		double sectorf = front->floorplane.ZatPoint(check);
		return (user->Top() >= sectorf && user->Z() <= sectorc);
	}

	// Now get the information from the line.
	P_LineOpening(open, NULL, line, check, &pos);
	if (open.range <= 0)
		goto onesided;

	if ((TexMan.FindSwitch(side->GetTexture(side_t::top))) != NULL)
	{

		// Check 3D floors on back side
		{
			sector_t * back = line->sidedef[1 - sideno]->sector;
			for (auto rover : back->e->XFloor.ffloors)
			{
				if (!(rover->flags & FF_EXISTS)) continue;
				if (!(rover->flags & FF_UPPERTEXTURE)) continue;

				if (user->isAbove(rover->top.plane->ZatPoint(check)) ||
					user->Top() < rover->bottom.plane->ZatPoint(check))
					continue;

				// This 3D floor depicts a switch texture in front of the player's eyes
				return true;
			}
		}

		return (user->Top() > open.top);
	}
	else if ((TexMan.FindSwitch(side->GetTexture(side_t::bottom))) != NULL)
	{
		// Check 3D floors on back side
		{
			sector_t * back = line->sidedef[1 - sideno]->sector;
			for (unsigned i = 0; i < back->e->XFloor.ffloors.Size(); i++)
			{
				F3DFloor *rover = back->e->XFloor.ffloors[i];
				if (!(rover->flags & FF_EXISTS)) continue;
				if (!(rover->flags & FF_LOWERTEXTURE)) continue;

				if (user->isAbove(rover->top.plane->ZatPoint(check)) ||
					user->Top() < rover->bottom.plane->ZatPoint(check))
					continue;

				// This 3D floor depicts a switch texture in front of the player's eyes
				return true;
			}
		}

		return (user->Z() < open.bottom);
	}
	else if ((flags & ML_3DMIDTEX) || (TexMan.FindSwitch(side->GetTexture(side_t::mid))) != NULL)
	{
		// 3DMIDTEX lines will force a mid texture check if no switch is found on this line
		// to keep compatibility with Eternity's implementation.
		if (!P_GetMidTexturePosition(line, sideno, &checktop, &checkbot))
			return false;
		return user->isBelow(checktop) && user->Top() > checkbot;
	}
	else
	{
		// no switch found. Check whether the player can touch either top or bottom texture
		return (user->Top() > open.top) || (user->isBelow(open.bottom));
	}
}